

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O3

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::VertexContainer::~VertexContainer(VertexContainer *this)

{
  void *pvVar1;
  pointer paVar2;
  long lVar3;
  
  if (this->m_colors != (aiColor4D *)0x0) {
    operator_delete__(this->m_colors);
  }
  lVar3 = 0x80;
  do {
    pvVar1 = *(void **)((long)this->m_numUVComps + lVar3 + -0x40);
    if (pvVar1 != (void *)0x0) {
      operator_delete__(pvVar1);
    }
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0xc0);
  paVar2 = (this->m_normals).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar2 != (pointer)0x0) {
    operator_delete(paVar2);
  }
  paVar2 = (this->m_vertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar2 != (pointer)0x0) {
    operator_delete(paVar2);
    return;
  }
  return;
}

Assistant:

OpenGEXImporter::VertexContainer::~VertexContainer() {
    delete[] m_colors;

    for(auto &texcoords : m_textureCoords) {
        delete [] texcoords;
    }
}